

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t create_decode_tables(uint8_t *bit_length,decode_table *table,wchar_t size)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  wchar_t pos;
  wchar_t dist;
  wchar_t bit_field;
  wchar_t last_pos;
  uint8_t clen;
  ssize_t quick_data_size;
  ssize_t cur_len;
  uint32_t decode_pos_clone [16];
  wchar_t lc [16];
  wchar_t i;
  wchar_t upper_limit;
  wchar_t code;
  wchar_t size_local;
  decode_table *table_local;
  uint8_t *bit_length_local;
  
  lc[0xf] = L'\0';
  memset(decode_pos_clone + 0xe,0,0x40);
  memset(table->decode_num,0,0x264);
  table->size = size;
  uVar5 = 7;
  if (size == L'Ĳ') {
    uVar5 = 10;
  }
  table->quick_bits = uVar5;
  for (lc[0xe] = L'\0'; lc[0xe] < size; lc[0xe] = lc[0xe] + L'\x01') {
    decode_pos_clone[(long)(int)(bit_length[lc[0xe]] & 0xf) + 0xe] =
         decode_pos_clone[(long)(int)(bit_length[lc[0xe]] & 0xf) + 0xe] + 1;
  }
  decode_pos_clone[0xe] = 0;
  table->decode_pos[0] = 0;
  table->decode_len[0] = 0;
  for (lc[0xe] = L'\x01'; lc[0xe] < L'\x10'; lc[0xe] = lc[0xe] + L'\x01') {
    uVar5 = decode_pos_clone[(long)lc[0xe] + 0xe];
    table->decode_len[lc[0xe]] = uVar5 + lc[0xf] << (0x10U - (char)lc[0xe] & 0x1f);
    table->decode_pos[lc[0xe]] =
         table->decode_pos[lc[0xe] + L'\xffffffff'] +
         decode_pos_clone[(long)(lc[0xe] + L'\xffffffff') + 0xe];
    lc[0xf] = (uVar5 + lc[0xf]) * 2;
  }
  memcpy(&cur_len,table->decode_pos,0x40);
  for (lc[0xe] = L'\0'; lc[0xe] < size; lc[0xe] = lc[0xe] + L'\x01') {
    bVar2 = bit_length[lc[0xe]] & 0xf;
    if (bVar2 != 0) {
      table->decode_num[(int)decode_pos_clone[(ulong)bVar2 - 2]] = (uint16_t)lc[0xe];
      decode_pos_clone[(ulong)bVar2 - 2] = decode_pos_clone[(ulong)bVar2 - 2] + 1;
    }
  }
  uVar5 = table->quick_bits;
  quick_data_size = 1;
  for (i = L'\0'; (long)i < 1L << ((byte)uVar5 & 0x3f); i = i + L'\x01') {
    iVar3 = i << (0x10U - (char)table->quick_bits & 0x1f);
    while( true ) {
      bVar1 = false;
      if (quick_data_size < 0x10) {
        bVar1 = table->decode_len[quick_data_size] <= iVar3;
      }
      if (!bVar1) break;
      quick_data_size = quick_data_size + 1;
    }
    table->quick_len[i] = (uint8_t)quick_data_size;
    wVar4 = table->decode_pos[quick_data_size & 0xf] +
            (iVar3 - table->decode_len[quick_data_size + -1] >>
            (0x10 - (uint8_t)quick_data_size & 0x1f));
    if ((quick_data_size < 0x10) && (wVar4 < size)) {
      table->quick_num[i] = table->decode_num[wVar4];
    }
    else {
      table->quick_num[i] = 0;
    }
  }
  return L'\0';
}

Assistant:

static int create_decode_tables(uint8_t* bit_length,
    struct decode_table* table, int size)
{
	int code, upper_limit = 0, i, lc[16];
	uint32_t decode_pos_clone[rar5_countof(table->decode_pos)];
	ssize_t cur_len, quick_data_size;

	memset(&lc, 0, sizeof(lc));
	memset(table->decode_num, 0, sizeof(table->decode_num));
	table->size = size;
	table->quick_bits = size == HUFF_NC ? 10 : 7;

	for(i = 0; i < size; i++) {
		lc[bit_length[i] & 15]++;
	}

	lc[0] = 0;
	table->decode_pos[0] = 0;
	table->decode_len[0] = 0;

	for(i = 1; i < 16; i++) {
		upper_limit += lc[i];

		table->decode_len[i] = upper_limit << (16 - i);
		table->decode_pos[i] = table->decode_pos[i - 1] + lc[i - 1];

		upper_limit <<= 1;
	}

	memcpy(decode_pos_clone, table->decode_pos, sizeof(decode_pos_clone));

	for(i = 0; i < size; i++) {
		uint8_t clen = bit_length[i] & 15;
		if(clen > 0) {
			int last_pos = decode_pos_clone[clen];
			table->decode_num[last_pos] = i;
			decode_pos_clone[clen]++;
		}
	}

	quick_data_size = (int64_t)1 << table->quick_bits;
	cur_len = 1;
	for(code = 0; code < quick_data_size; code++) {
		int bit_field = code << (16 - table->quick_bits);
		int dist, pos;

		while(cur_len < rar5_countof(table->decode_len) &&
				bit_field >= table->decode_len[cur_len]) {
			cur_len++;
		}

		table->quick_len[code] = (uint8_t) cur_len;

		dist = bit_field - table->decode_len[cur_len - 1];
		dist >>= (16 - cur_len);

		pos = table->decode_pos[cur_len & 15] + dist;
		if(cur_len < rar5_countof(table->decode_pos) && pos < size) {
			table->quick_num[code] = table->decode_num[pos];
		} else {
			table->quick_num[code] = 0;
		}
	}

	return ARCHIVE_OK;
}